

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void RangeEnc_ShiftLow(CRangeEnc *p)

{
  long lVar1;
  char *pcVar2;
  long in_RDI;
  Byte *buf;
  Byte temp;
  undefined7 in_stack_fffffffffffffff0;
  char cVar3;
  
  if (((uint)*(undefined8 *)(in_RDI + 8) < 0xff000000) ||
     ((int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20) != 0)) {
    cVar3 = *(char *)(in_RDI + 4);
    do {
      pcVar2 = *(char **)(in_RDI + 0x18) + 1;
      **(char **)(in_RDI + 0x18) = cVar3 + (char)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
      *(char **)(in_RDI + 0x18) = pcVar2;
      if (pcVar2 == *(char **)(in_RDI + 0x20)) {
        RangeEnc_FlushStream((CRangeEnc *)CONCAT17(cVar3,in_stack_fffffffffffffff0));
      }
      cVar3 = -1;
      lVar1 = *(long *)(in_RDI + 0x10) + -1;
      *(long *)(in_RDI + 0x10) = lVar1;
    } while (lVar1 != 0);
    *(char *)(in_RDI + 4) = (char)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x18);
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  *(ulong *)(in_RDI + 8) = (ulong)(uint)((int)*(undefined8 *)(in_RDI + 8) << 8);
  return;
}

Assistant:

static void MY_FAST_CALL RangeEnc_ShiftLow(CRangeEnc *p)
{
  if ((UInt32)p->low < (UInt32)0xFF000000 || (unsigned)(p->low >> 32) != 0)
  {
    Byte temp = p->cache;
    do
    {
      Byte *buf = p->buf;
      *buf++ = (Byte)(temp + (Byte)(p->low >> 32));
      p->buf = buf;
      if (buf == p->bufLim)
        RangeEnc_FlushStream(p);
      temp = 0xFF;
    }
    while (--p->cacheSize != 0);
    p->cache = (Byte)((UInt32)p->low >> 24);
  }
  p->cacheSize++;
  p->low = (UInt32)p->low << 8;
}